

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O1

void gen_hermite_ek_compute(int n,double alpha,double *x,double *w)

{
  ulong uVar1;
  double *e;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  
  dVar4 = tgamma((alpha + 1.0) * 0.5);
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (long)n * 8;
  }
  e = (double *)operator_new__(uVar2);
  uVar2 = (ulong)(uint)n;
  if (0 < n) {
    uVar3 = 0;
    do {
      dVar5 = alpha;
      if ((uVar3 & 1) != 0) {
        dVar5 = -0.0;
      }
      uVar1 = uVar3 + 1;
      e[uVar3] = ((double)(int)uVar1 + dVar5) * 0.5;
      uVar3 = uVar1;
    } while (uVar2 != uVar1);
  }
  if (0 < n) {
    uVar3 = 0;
    do {
      dVar5 = e[uVar3];
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      e[uVar3] = dVar5;
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  if (0 < n) {
    memset(x,0,uVar2 * 8);
  }
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  *w = dVar4;
  if (1 < n) {
    memset(w + 1,0,(ulong)(n - 1) << 3);
  }
  imtqlx(n,x,e,w);
  if (0 < n) {
    uVar3 = 0;
    do {
      w[uVar3] = w[uVar3] * w[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  operator_delete__(e);
  return;
}

Assistant:

void gen_hermite_ek_compute ( int n, double alpha, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    GEN_HERMITE_EK_COMPUTE computes a generalized Gauss-Hermite quadrature rule.
//
//  Discussion:
//
//    The code uses an algorithm by Elhay and Kautsky.
//
//    The integral:
//
//      integral ( -oo < x < +oo ) |x|^alpha exp(-x^2) f(x) dx
//
//    The quadrature rule:
//
//      sum ( 1 <= i <= n ) w(i) * f ( x(i) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    30 April 2011
//
//  Author:
//
//    Original FORTRAN77 version by Sylvan Elhay, Jaroslav Kautsky.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Sylvan Elhay, Jaroslav Kautsky,
//    Algorithm 655: IQPACK, FORTRAN Subroutines for the Weights of
//    Interpolatory Quadrature,
//    ACM Transactions on Mathematical Software,
//    Volume 13, Number 4, December 1987, pages 399-415.
//
//  Parameters:
//
//    Input, int N, the number of abscissas.
//
//    Input, double ALPHA, the parameter.
//    -1.0 < ALPHA.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double *bj;
  int i;
  double i_r8;
  double zemu;
//
//  Define the zero-th moment.
//
  zemu = tgamma ( ( alpha + 1.0 ) / 2.0 );
//
//  Define the Jacobi matrix.
//
  bj = new double[n];

  for ( i = 0; i < n; i++ )
  {
    i_r8 = double( i + 1 );
    if ( ( i % 2 ) == 0 )
    {
      bj[i] = ( i_r8 + alpha ) / 2.0;
    }
    else
    {
      bj[i] = i_r8 / 2.0;
    }
  }

  for ( i = 0; i < n; i++ )
  {
    bj[i] = sqrt ( bj[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = 0.0;
  }

  w[0] = sqrt ( zemu );
  for ( i = 1; i < n; i++ )
  {
    w[i] = 0.0;
  }
//
//  Diagonalize the Jacobi matrix.
//
  imtqlx ( n, x, bj, w );

  for ( i = 0; i < n; i++ )
  {
    w[i] = w[i] * w[i];
  }

  delete [] bj;

  return;
}